

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  __pointer_type pNVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  Node *pNVar5;
  bool bVar6;
  
  iVar3 = (this->max_height_).super___atomic_base<int>._M_i + -1;
  pNVar1 = this->head_;
  do {
    pNVar5 = pNVar1;
    pNVar4 = (Node *)(pNVar5->next_ + iVar3);
    while ((pNVar1 = ((__base_type *)&pNVar4->key)->_M_p, pNVar1 == (__pointer_type)0x0 ||
           (iVar2 = MemTable::KeyComparator::operator()(&this->compare_,pNVar1->key,*key),
           -1 < iVar2))) {
      bVar6 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar6) {
        return pNVar5;
      }
      pNVar4 = (Node *)((long)(pNVar4 + 0xffffffffffffffff) + 8);
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}